

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_hash.cc
# Opt level: O0

uint64_t absl::lts_20240722::hash_internal::LowLevelHash
                   (void *data,size_t len,uint64_t seed,uint64_t *salt)

{
  uint32_t uVar1;
  ulong local_60;
  uint64_t b;
  uint64_t a;
  uint64_t current_state;
  uint64_t starting_length;
  uint8_t *ptr;
  uint64_t *salt_local;
  uint64_t seed_local;
  size_t len_local;
  void *data_local;
  
  if (len < 0x11) {
    data_local = (void *)(seed ^ *salt);
    if (len != 0) {
      if (len < 9) {
        if (len < 4) {
          b = (uint64_t)(int)(uint)CONCAT11(*data,*(undefined1 *)((long)data + (len - 1)));
          local_60 = (ulong)*(byte *)((long)data + (len >> 1));
        }
        else {
          uVar1 = base_internal::UnalignedLoad32(data);
          b = (uint64_t)uVar1;
          uVar1 = base_internal::UnalignedLoad32((Nonnull<const_void_*>)((long)data + (len - 4)));
          local_60 = (ulong)uVar1;
        }
      }
      else {
        b = base_internal::UnalignedLoad64(data);
        local_60 = base_internal::UnalignedLoad64((Nonnull<const_void_*>)((long)data + (len - 8)));
      }
      data_local = (void *)Mix(b ^ salt[1] ^ len,local_60 ^ (ulong)data_local);
    }
  }
  else {
    data_local = (void *)LowLevelHashLenGt16(data,len,seed,salt);
  }
  return (uint64_t)data_local;
}

Assistant:

uint64_t LowLevelHash(const void* data, size_t len, uint64_t seed,
                      const uint64_t salt[5]) {
  if (len > 16) return LowLevelHashLenGt16(data, len, seed, salt);

  // Prefetch the cacheline that data resides in.
  PrefetchToLocalCache(data);
  const uint8_t* ptr = static_cast<const uint8_t*>(data);
  uint64_t starting_length = static_cast<uint64_t>(len);
  uint64_t current_state = seed ^ salt[0];
  if (len == 0) return current_state;

  uint64_t a = 0;
  uint64_t b = 0;

  // We now have a data `ptr` with at least 1 and at most 16 bytes.
  if (len > 8) {
    // When we have at least 9 and at most 16 bytes, set A to the first 64
    // bits of the input and B to the last 64 bits of the input. Yes, they
    // will overlap in the middle if we are working with less than the full 16
    // bytes.
    a = absl::base_internal::UnalignedLoad64(ptr);
    b = absl::base_internal::UnalignedLoad64(ptr + len - 8);
  } else if (len > 3) {
    // If we have at least 4 and at most 8 bytes, set A to the first 32
    // bits and B to the last 32 bits.
    a = absl::base_internal::UnalignedLoad32(ptr);
    b = absl::base_internal::UnalignedLoad32(ptr + len - 4);
  } else {
    // If we have at least 1 and at most 3 bytes, read 2 bytes into A and the
    // other byte into B, with some adjustments.
    a = static_cast<uint64_t>((ptr[0] << 8) | ptr[len - 1]);
    b = static_cast<uint64_t>(ptr[len >> 1]);
  }

  return Mix(a ^ salt[1] ^ starting_length, b ^ current_state);
}